

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d63_q1a_hiatus.cpp
# Opt level: O2

int main(void)

{
  _Rb_tree_header *p_Var1;
  istream *piVar2;
  iterator iVar3;
  ostream *poVar4;
  bool bVar5;
  int b;
  int a;
  pair<int,_int> local_70;
  int m;
  int n;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_> d
  ;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105170) = 0;
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&n);
  std::istream::operator>>(piVar2,&m);
  p_Var1 = &d._M_t._M_impl.super__Rb_tree_header;
  d._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  d._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  d._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  d._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  d._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  while( true ) {
    bVar5 = n == 0;
    n = n + -1;
    if (bVar5) break;
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&a);
    std::istream::operator>>(piVar2,&b);
    local_70.second = b;
    local_70.first = a;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::_M_insert_unique<std::pair<int,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)&d,&local_70);
  }
LAB_00101311:
  do {
    while( true ) {
      bVar5 = m == 0;
      m = m + -1;
      if (bVar5) {
        std::
        _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
        ::~_Rb_tree(&d._M_t);
        return 0;
      }
      piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&a);
      std::istream::operator>>(piVar2,&b);
      local_70.second = b;
      local_70.first = a;
      iVar3 = std::
              _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              ::find(&d._M_t,&local_70);
      if ((_Rb_tree_header *)iVar3._M_node == p_Var1) break;
      std::operator<<((ostream *)&std::cout,"0 0 ");
    }
    do {
      if ((a < (int)d._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color) ||
         ((a == d._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color &&
          (b < *(int *)&d._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].field_0x4)))) {
        std::operator<<((ostream *)&std::cout,"-1 -1 ");
        goto LAB_00101311;
      }
      if (b < 2) {
        a = a + -1;
        b = 0xc;
      }
      else {
        b = b + -1;
      }
      local_70.second = b;
      local_70.first = a;
      iVar3 = std::
              _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              ::find(&d._M_t,&local_70);
    } while ((_Rb_tree_header *)iVar3._M_node == p_Var1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3._M_node[1]._M_color);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)&iVar3._M_node[1].field_0x4);
    std::operator<<(poVar4," ");
  } while( true );
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    int n, m;
    cin >> n >> m;
    set<pair<int, int>> d;

    while (n--) {
        int a, b;
        cin >> a >> b;

        d.insert(make_pair(a, b));
    }

    while (m--) {
        int a, b;
        cin >> a >> b;

        auto it = d.find(make_pair(a, b));
        if (it != d.end()) {
            cout << "0 0 ";
            continue;
        }

        while (true) {
            auto beg = d.begin();
            if (a < beg->first || ((a == beg->first) && b < beg->second)) {
                cout << "-1 -1 ";
                break;
            }

            if (b - 1 < 1) {
                b = 12;
                --a;
            } else {
                --b;
            }

            auto it2 = d.find(make_pair(a, b));
            if (it2 != d.end()) {
                cout << it2->first << " " << it2->second << " ";
                break;
            }
        }
    }
}